

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

int __thiscall
FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>
::size(FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>
       *this)

{
  int iVar1;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar2;
  int iVar3;
  
  pFVar2 = (this->left_->fadexpr_).left_;
  iVar3 = (((pFVar2->fadexpr_).left_)->dx_).num_elts;
  iVar1 = (((pFVar2->fadexpr_).right_)->dx_).num_elts;
  if (iVar1 < iVar3) {
    iVar1 = iVar3;
  }
  iVar3 = FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>
          ::size(&this->right_->fadexpr_);
  if (iVar3 < iVar1) {
    iVar3 = iVar1;
  }
  return iVar3;
}

Assistant:

int size() const {
    int lsz = left_.size(), rsz = right_.size();
    return std::max(lsz, rsz);
  }